

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Constructor::do_call
          (Dynamic_Object_Constructor *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  initializer_list<chaiscript::Boxed_Value> __l;
  allocator_type local_c9;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_b8 [16];
  string local_a8;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> new_params;
  
  std::__cxx11::string::string
            ((string *)(local_b8 + 0x10),
             (string *)
             &params[1].
              super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Dynamic_Object::Dynamic_Object((Dynamic_Object *)&new_params,(string *)(local_b8 + 0x10));
  Boxed_Value::Boxed_Value<chaiscript::dispatch::Dynamic_Object,void>
            ((Boxed_Value *)this,(Dynamic_Object *)&new_params,true);
  Dynamic_Object::~Dynamic_Object((Dynamic_Object *)&new_params);
  std::__cxx11::string::~string((string *)(local_b8 + 0x10));
  std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_c8,
             (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_c8;
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
            (&new_params,__l,&local_c9);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
  std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
  insert<__gnu_cxx::__normal_iterator<chaiscript::Boxed_Value_const*,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>,void>
            ((vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>> *)&new_params,
             (const_iterator)
             new_params.
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (Boxed_Value *)(t_conversions->m_conversions)._M_data,
             (Boxed_Value *)(t_conversions->m_saves)._M_data);
  Proxy_Function_Base::operator()
            ((Proxy_Function_Base *)local_b8,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             params[3].
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
             _M_impl.super__Vector_impl_data._M_start,(Type_Conversions_State *)&new_params);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            (&new_params);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual Boxed_Value do_call(const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions) const CHAISCRIPT_OVERRIDE
          {
            auto bv = Boxed_Value(Dynamic_Object(m_type_name), true);
            std::vector<Boxed_Value> new_params{bv};
            new_params.insert(new_params.end(), params.begin(), params.end());

            (*m_func)(new_params, t_conversions);

            return bv;
          }